

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualMappedPointerVector.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
gmlc::containers::
DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle>::
insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchValue1,
          InterfaceHandle *searchValue2,GlobalHandle *data,
          basic_string_view<char,_std::char_traits<char>_> *data_1,
          basic_string_view<char,_std::char_traits<char>_> *data_2,
          basic_string_view<char,_std::char_traits<char>_> *data_3)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  GlobalHandle *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
  *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  optional<unsigned_long> oVar3;
  size_type index;
  iterator fnd2;
  iterator fnd;
  unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
  *in_stack_ffffffffffffff48;
  unsigned_long *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff61;
  unsigned_long local_78;
  size_type local_70;
  _Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false> local_60;
  _Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false> local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_48;
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_ffffffffffffff48,(key_type *)0x4f48ca);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)in_stack_ffffffffffffff48);
  bVar1 = std::__detail::operator==(&local_48,&local_50);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
         ::find(in_stack_ffffffffffffff48,(key_type *)0x4f490f);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffff48);
    bVar1 = std::__detail::operator==(&local_58,&local_60);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
      uVar2 = extraout_RDX;
      goto LAB_004f4a1c;
    }
  }
  local_70 = std::
             vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
             ::size(in_RDI);
  __t = &local_78;
  std::
  make_unique<helics::InputInfo,helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            (in_RDX,in_RCX,in_R8,in_R9);
  std::
  vector<std::unique_ptr<helics::InputInfo,std::default_delete<helics::InputInfo>>,std::allocator<std::unique_ptr<helics::InputInfo,std::default_delete<helics::InputInfo>>>>
  ::emplace_back<std::unique_ptr<helics::InputInfo,std::default_delete<helics::InputInfo>>>
            ((vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
              *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
             (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
             in_stack_ffffffffffffff58);
  std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::~unique_ptr
            ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
             CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60));
  std::
  unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
  ::emplace<std::__cxx11::string_const&,unsigned_long&>
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58,(unsigned_long *)in_RDI);
  std::
  unordered_map<helics::InterfaceHandle,unsigned_long,std::hash<helics::InterfaceHandle>,std::equal_to<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>>
  ::emplace<helics::InterfaceHandle_const&,unsigned_long&>
            ((unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
              *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
             (InterfaceHandle *)in_stack_ffffffffffffff58,(unsigned_long *)in_RDI);
  std::optional<unsigned_long>::optional<unsigned_long,_true>((optional<unsigned_long> *)in_RDI,__t)
  ;
  uVar2 = extraout_RDX_00;
LAB_004f4a1c:
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            const searchType1& searchValue1,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                auto fnd2 = lookup2.find(searchValue2);
                if (fnd2 != lookup2.end()) {
                    return std::nullopt;
                }
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(
                std::make_unique<VType>(std::forward<Us>(data)...));
            lookup1.emplace(searchValue1, index);
            lookup2.emplace(searchValue2, index);
            return index;
        }